

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O3

double __thiscall sophia_interface::crossection(sophia_interface *this,double x,int NDIR,int NL0)

{
  runtime_error *this_00;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  sophia_interface *this_01;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_1c8 [10];
  undefined1 local_178 [8];
  double adStack_170 [9];
  double dStack_128;
  double sig_res [9];
  double dStack_d8;
  double SIG0 [9];
  double s;
  double local_48;
  double local_30;
  
  if (NL0 - 0xfU < 0xfffffffe) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"crossection: particle ID incorrectly specified.");
    goto LAB_0010bc7a;
  }
  SIG0[5] = 0.0;
  SIG0[6] = 0.0;
  SIG0[3] = 0.0;
  SIG0[4] = 0.0;
  SIG0[1] = 0.0;
  SIG0[2] = 0.0;
  SIG0[0] = 0.0;
  SIG0[7] = 0.0;
  if (NL0 == 0xd) {
    pdVar2 = AMRESp;
    pdVar3 = local_1c8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar3 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    }
    pdVar2 = WIDTHp;
    this_01 = (sophia_interface *)local_178;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)this_01 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      this_01 = (sophia_interface *)(this_01->K[0] + 1);
    }
    lVar1 = 0;
    do {
      SIG0[lVar1 + -1] = RATIOJp[lVar1] * 5.5581116134360045 * BGAMMAp[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
  }
  else {
    pdVar2 = AMRESn;
    pdVar3 = local_1c8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar3 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    }
    pdVar2 = WIDTHn;
    this_01 = (sophia_interface *)local_178;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)this_01 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      this_01 = (sophia_interface *)(this_01->K[0] + 1);
    }
    lVar1 = 0;
    do {
      SIG0[lVar1 + -1] = RATIOJn[lVar1] * 5.542742930384507 * BGAMMAn[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
  }
  sig_res[5] = 0.0;
  sig_res[6] = 0.0;
  sig_res[3] = 0.0;
  sig_res[4] = 0.0;
  sig_res[1] = 0.0;
  sig_res[2] = 0.0;
  dStack_128 = 0.0;
  sig_res[0] = 0.0;
  sig_res[7] = 0.0;
  dVar5 = AM[NL0 - 1];
  dVar5 = dVar5 * dVar5 + (dVar5 + dVar5) * x;
  dVar7 = 0.0;
  if (dVar5 < 1.1646) {
    return 0.0;
  }
  SIG0[8] = 0.0;
  local_30 = 0.0;
  dVar6 = 0.0;
  if (x <= 10.0) {
    dVar6 = x * 1.87654 + 0.8803505929000001;
    dVar7 = (double)local_178 * (double)local_178 * dVar6;
    dVar10 = (dVar6 / x) / x;
    dVar8 = dVar6 - local_1c8[0] * local_1c8[0];
    local_30 = Ef(this_01,x,0.152,0.17);
    local_30 = local_30 * ((dVar10 * 0.0 * dVar7) / (dVar8 * dVar8 + dVar7));
    dStack_128 = local_30;
    lVar1 = 0;
    do {
      dVar8 = adStack_170[lVar1] * adStack_170[lVar1] * dVar6;
      dVar7 = SIG0[lVar1];
      dVar9 = dVar6 - local_1c8[lVar1 + 1] * local_1c8[lVar1 + 1];
      dVar4 = Ef(this_01,x,0.15,0.38);
      dVar4 = dVar4 * ((dVar7 * dVar10 * dVar8) / (dVar9 * dVar9 + dVar8));
      sig_res[lVar1] = dVar4;
      local_30 = local_30 + dVar4;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    if ((x <= 0.1) || (0.6 <= x)) {
      dVar6 = 0.0;
      if (0.152 <= x) {
        dVar7 = pow((x + -0.152) / 0.098,1.2894736842105265);
        dVar6 = pow(x * 4.0,-3.2894736842105265);
        dVar6 = dVar6 * dVar7 * 92.7;
      }
    }
    else {
      dVar7 = 0.0;
      if (0.152 <= x) {
        dVar7 = pow((x + -0.152) / 0.098,1.2894736842105265);
        dVar6 = pow(x * 4.0,-3.2894736842105265);
        dVar7 = dVar6 * dVar7 * 92.7;
      }
      dVar6 = exp((-(x + -0.29) * (x + -0.29)) / 0.002);
      dVar8 = exp((-(x + -0.37) * (x + -0.37)) / 0.002);
      dVar6 = dVar8 * -15.0 + dVar6 * 40.0 + dVar7;
    }
    SIG0[8] = 0.0;
    if (0.4 <= x) {
      dVar7 = pow((x + -0.4) / 0.19999999999999996,0.9999999999999996);
      dVar8 = pow(x / 0.6,-2.9999999999999996);
      SIG0[8] = dVar8 * dVar7 * 37.7;
    }
    dVar7 = dVar6 + SIG0[8];
  }
  dVar8 = Ef(this_01,x,0.5,0.1);
  local_48 = pow(dVar5,-0.34);
  if (NL0 == 0xd) {
    local_48 = dVar8 * 80.3 * local_48;
    if (0.85 < x) {
      dVar8 = pow(dVar5,-0.34);
      dVar10 = pow(dVar5,0.095);
      dVar8 = dVar8 * 29.3;
      goto LAB_0010ba6d;
    }
LAB_0010bbb3:
    dVar4 = 0.0;
    dVar8 = 0.0;
    dVar10 = 0.0;
    dVar5 = 0.0;
  }
  else {
    local_48 = dVar8 * 60.2 * local_48;
    if (x <= 0.85) goto LAB_0010bbb3;
    dVar8 = pow(dVar5,-0.34);
    dVar10 = pow(dVar5,0.095);
    dVar8 = dVar8 * 26.4;
LAB_0010ba6d:
    dVar4 = exp((x + -0.85) / -0.69);
    dVar9 = (1.0 - dVar4) * (dVar8 + dVar10 * 59.3);
    dVar10 = dVar9 * 0.89;
    dVar8 = pow(x + -0.85,0.75);
    dVar4 = pow(x,-0.44);
    dVar5 = pow(dVar5,0.08);
    dVar8 = exp(dVar8 / -0.64);
    dVar5 = (1.0 - dVar8) * 0.96 * (dVar4 * 74.1 + dVar5 * 62.0);
    dVar8 = dVar5 * 0.14;
    dVar4 = dVar5 * 0.013 + dVar8;
    dVar5 = local_48 - (dVar9 * -0.11 + dVar4);
    local_48 = 0.0;
    if (0.0 <= dVar5) {
      local_48 = dVar5;
    }
    dVar5 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar10 |
                    (ulong)(dVar10 + dVar5) & -(ulong)(dVar5 < 0.0));
    dVar10 = dVar5 + dVar4;
  }
  switch(NDIR) {
  case 0:
    dVar10 = local_30 + dVar7 + dVar4;
    goto LAB_0010bc1e;
  case 1:
    goto switchD_0010bbdd_caseD_1;
  case 2:
    dVar5 = dVar7 + local_30;
    break;
  case 3:
    dVar10 = local_30 + dVar7 + dVar10;
LAB_0010bc1e:
    dVar5 = local_48 + dVar10;
    break;
  case 4:
    dVar5 = dVar7;
    break;
  case 5:
    break;
  case 6:
    local_30 = local_30 + SIG0[8];
    goto switchD_0010bbdd_caseD_1;
  case 7:
    local_30 = local_30 + dVar6;
    goto switchD_0010bbdd_caseD_1;
  case 8:
    local_30 = local_30 + dVar7 + dVar8;
    goto switchD_0010bbdd_caseD_1;
  case 9:
    local_30 = local_30 + dVar7 + dVar4;
switchD_0010bbdd_caseD_1:
    dVar5 = local_30;
    break;
  case 10:
    dVar5 = dVar4;
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    dVar5 = sig_res[(ulong)(NDIR - 0xb) - 1];
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"wrong input NDIR in crossection.f !");
LAB_0010bc7a:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return dVar5;
}

Assistant:

double sophia_interface::crossection(double x, int NDIR, int NL0) {
// calculates crossection of Nucleon-gamma-interaction
// (see thesis of J.Rachen, p.45ff and corrections
// report from 27/04/98, 5/05/98, 22/05/98 of J.Rachen)
// ** Date: 20/01/98   **
// ** correct.:27/04/98**
// ** update: 23/05/98 **
// ** author: A.Muecke **

    if (NL0 != 13 && NL0 != 14) throw std::runtime_error("crossection: particle ID incorrectly specified.");
    const double AM2 = (NL0 == 13)? 0.880351 : 0.882792;  // used to be array AM2[49]. Only these two values of it are ever used.
    double SIG0[9] = {0.};
    double AMRES[9] = {0.};
    double WIDTH[9] = {0.};

    if (NL0 == 13) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJp[i] * BGAMMAp[i];
            AMRES[i] = AMRESp[i];
            WIDTH[i] = WIDTHp[i];
        }
    }

    if (NL0 == 14) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJn[i] * BGAMMAn[i];
            AMRES[i] = AMRESn[i];
            WIDTH[i] = WIDTHn[i];
        }
    }

    double sig_res[9] = {0.};

    const double sth = 1.1646;
    const double pm = AM[NL0 - 1];
    const double s = pm * pm + 2. * pm * x;
    if (s < sth) {
        return 0.;
    }
    double cross_res = 0.;
    double cross_dir = 0.;
    double cross_dir1 = 0.;
    double cross_dir2 = 0.;
    if (x <= 10.) {
        // RESONANCES:
        cross_res = breitwigner(SIG0[0], WIDTH[0], AMRES[0], x) * Ef(x, 0.152, 0.17);
        sig_res[0] = cross_res;

        for (int Ni = 1; Ni < 9; ++Ni) {
            sig_res[Ni] = breitwigner(SIG0[Ni], WIDTH[Ni], AMRES[Ni], x) * Ef(x, 0.15, 0.38);
            cross_res += sig_res[Ni];
        }
        // DIRECT CHANNEL:
        if (x > 0.1 && x < 0.6) {
            cross_dir1 = singleback(x) + 40. * std::exp(-(x - 0.29) * (x - 0.29) / 0.002) - 15. * std::exp(-(x - 0.37) * (x - 0.37) / 0.002);
        } else {
            cross_dir1 = singleback(x);
        }
        cross_dir2 = twoback(x);
        cross_dir = cross_dir1 + cross_dir2;
    }

    // FRAGMENTATION 2:
    double cross_frag2 = 0.;
    if (NL0 == 13) {
          cross_frag2 = 80.3 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    } else if (NL0 == 14) {
          cross_frag2 = 60.2 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    }

    // MULTIPION PRODUCTION/FRAGMENTATION 1 CROSS SECTION
    double cross_diffr = 0.;
    double cross_diffr1 = 0.;
    double cross_diffr2 = 0.;
    double cs_multidiff = 0.;
    double cs_multi = 0.;
    if (x > 0.85) {
        double ss1 = (x - .85) / .69;
        double ss2 = 0.;
        if (NL0 == 13) {
            ss2 = 29.3 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        } else if (NL0 == 14) {
            ss2 = 26.4 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        }
        cs_multidiff = (1. - std::exp(-ss1)) * ss2;
        cs_multi = 0.89 * cs_multidiff;

        // DIFFRACTIVE SCATTERING:
        cross_diffr1 = .099 * cs_multidiff;
        cross_diffr2 = .011 * cs_multidiff;
        cross_diffr = 0.11 * cs_multidiff;

        ss1 = std::pow((x - .85), .75) / .64;
        ss2 = 74.1 * std::pow(x, -.44) + 62. * std::pow(s, .08);
        double cs_tmp = 0.96 * (1. - std::exp(-ss1)) * ss2;
        cross_diffr1 = 0.14 * cs_tmp;
        cross_diffr2 = 0.013 * cs_tmp;
        double cs_delta = cross_frag2 - (cross_diffr1 + cross_diffr2 - cross_diffr);
        if (cs_delta < 0.) {
            cross_frag2 = 0.;
            cs_multi += cs_delta;
        } else {
            cross_frag2 = cs_delta;
        }
        cross_diffr = cross_diffr1 + cross_diffr2;
        cs_multidiff = cs_multi + cross_diffr;
    }

    double xSection = 0.;
    switch (NDIR) {
        case 0:
            xSection = cross_res + cross_dir + cross_diffr + cross_frag2;
            break;
        case 1:
            xSection = cross_res;
            break;
        case 2:
            xSection = cross_res + cross_dir;
            break;
        case 3:
            xSection = cross_res + cross_dir + cs_multidiff + cross_frag2;
            break;
        case 4:
            xSection = cross_dir;
            break;
        case 5:
            xSection = cs_multi;
            break;
        case 6:
            xSection = cross_res + cross_dir2;
            break;
        case 7:
            xSection = cross_res + cross_dir1;
            break;
        case 8:
            xSection = cross_res + cross_dir + cross_diffr1;
            break;
        case 9:
            xSection = cross_res + cross_dir + cross_diffr;
            break;
        case 10:
            xSection = cross_diffr;
            break;
        case 11:
        case 12:
        case 13:
        case 14:
        case 15:
        case 16:
        case 17:
        case 18:
        case 19:
            xSection = sig_res[NDIR - 11];
            break;
        default:
            throw std::runtime_error("wrong input NDIR in crossection.f !");
    }
    return xSection;
}